

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int32 ngram_ng_prob(ngram_model_t *model,int32 wid,int32 *history,int32 n_hist,int32 *n_used)

{
  ngram_class_t *lmclass_00;
  int32 iVar1;
  ngram_class_t *lmclass;
  int local_40;
  int i;
  int32 class_weight;
  int32 prob;
  int32 *n_used_local;
  int32 n_hist_local;
  int32 *history_local;
  int32 wid_local;
  ngram_model_t *model_local;
  
  local_40 = 0;
  if (wid == -1) {
    model_local._4_4_ = model->log_zero;
  }
  else {
    history_local._4_4_ = wid;
    if ((wid & 0x80000000U) != 0) {
      lmclass_00 = model->classes[(int)(wid >> 0x18 & 0x7f)];
      local_40 = ngram_class_prob(lmclass_00,wid);
      if (local_40 == 1) {
        return 1;
      }
      history_local._4_4_ = lmclass_00->tag_wid;
    }
    for (lmclass._4_4_ = 0; lmclass._4_4_ < n_hist; lmclass._4_4_ = lmclass._4_4_ + 1) {
      if ((history[lmclass._4_4_] != -1) && ((history[lmclass._4_4_] & 0x80000000U) != 0)) {
        history[lmclass._4_4_] =
             model->classes[(int)(history[lmclass._4_4_] >> 0x18 & 0x7f)]->tag_wid;
      }
    }
    iVar1 = (*model->funcs->raw_score)(model,history_local._4_4_,history,n_hist,n_used);
    model_local._4_4_ = iVar1 + local_40;
  }
  return model_local._4_4_;
}

Assistant:

int32
ngram_ng_prob(ngram_model_t * model, int32 wid, int32 * history,
              int32 n_hist, int32 * n_used)
{
    int32 prob, class_weight = 0;
    int i;

    /* Closed vocabulary, OOV word probability is zero */
    if (wid == NGRAM_INVALID_WID)
        return model->log_zero;

    /* "Declassify" wid and history */
    if (NGRAM_IS_CLASSWID(wid)) {
        ngram_class_t *lmclass = model->classes[NGRAM_CLASSID(wid)];

        class_weight = ngram_class_prob(lmclass, wid);
        if (class_weight == 1)  /* Meaning, not found in class. */
            return class_weight;
        wid = lmclass->tag_wid;
    }
    for (i = 0; i < n_hist; ++i) {
        if (history[i] != NGRAM_INVALID_WID
            && NGRAM_IS_CLASSWID(history[i]))
            history[i] =
                model->classes[NGRAM_CLASSID(history[i])]->tag_wid;
    }
    prob = (*model->funcs->raw_score) (model, wid, history,
                                       n_hist, n_used);
    /* Multiply by unigram in-class weight. */
    return prob + class_weight;
}